

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp1_fast_iVar5(uint *pInOut,int nWords,int *pDifStart)

{
  int iVar1;
  int local_2c;
  int temp;
  int i;
  int *pDifStart_local;
  int nWords_local;
  uint *pInOut_local;
  
  local_2c = nWords * 2 + -2;
  while( true ) {
    if (local_2c < 0) {
      *pDifStart = 0;
      return 1;
    }
    iVar1 = CompareWords((ulong)pInOut[local_2c],(ulong)pInOut[local_2c + -1]);
    if (iVar1 != 0) break;
    local_2c = local_2c + -4;
  }
  if (iVar1 == -1) {
    *pDifStart = local_2c + 2;
    return 1;
  }
  *pDifStart = local_2c + 2;
  return 2;
}

Assistant:

int minTemp1_fast_iVar5(unsigned* pInOut, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp1_fast_iVar5\n");
    for(i=(nWords)*2 - 2; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i],pInOut[i-1]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+2;
            return 1;
        }
        else
        {
            *pDifStart = i+2;
            return 2;
        }
    }
    *pDifStart=0;
    return 1;
}